

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.cpp
# Opt level: O0

void __thiscall
GrpcLikeMessageBuilder::GrpcLikeMessageBuilder
          (GrpcLikeMessageBuilder *this,GrpcLikeMessageBuilder *other)

{
  size_t buffer_minalign;
  GrpcLikeMessageBuilder *other_local;
  GrpcLikeMessageBuilder *this_local;
  
  AllocatorMember::AllocatorMember(&this->super_AllocatorMember);
  buffer_minalign = flatbuffers::AlignOf<unsigned_long>();
  flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            (&this->super_FlatBufferBuilder,0x400,(Allocator *)this,false,buffer_minalign);
  Swap(this,other);
  return;
}

Assistant:

GrpcLikeMessageBuilder(GrpcLikeMessageBuilder &&other)
      : FlatBufferBuilder(1024, &member_allocator_, false) {
    // Default construct and swap idiom.
    Swap(other);
  }